

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

void __thiscall ObserverManager_Basic_Test::TestBody(ObserverManager_Basic_Test *this)

{
  bool bVar1;
  A *pAVar2;
  char *pcVar3;
  AssertHelper local_328;
  Message local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_2c8;
  Message local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_268;
  Message local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  allocator local_201;
  string local_200;
  A *local_1e0;
  A *a2;
  string local_1d0;
  A *local_1a0;
  A *a1;
  stringstream out;
  ostream local_188 [376];
  ObserverManager_Basic_Test *local_10;
  ObserverManager_Basic_Test *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&a1);
  pAVar2 = (A *)operator_new(0x38);
  a2._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"Tic",(allocator *)((long)&a2 + 7));
  A::A(pAVar2,local_188,&local_1d0);
  a2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&a2 + 7));
  local_1a0 = pAVar2;
  ObserverManager::subscribe<FooBarProtocol,A>(pAVar2);
  pAVar2 = (A *)operator_new(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_200,"Tic",&local_201);
  A::A(pAVar2,local_188,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  local_1e0 = pAVar2;
  ObserverManager::subscribe<FooBarProtocol,A>(pAVar2);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19
  ;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[17],std::__cxx11::string>
            ((EqHelper<false> *)local_238,"\"Tic Tic Tac Tac \"","out.str()",
             (char (*) [17])"Tic Tic Tac Tac ",&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  if (local_1a0 != (A *)0x0) {
    (*(local_1a0->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])();
  }
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  gtest_ar_1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[25],std::__cxx11::string>
            ((EqHelper<false> *)local_298,"\"Tic Tic Tac Tac Tic Tac \"","out.str()",
             (char (*) [25])"Tic Tic Tac Tac Tic Tac ",&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x1c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  ObserverManager::unsubscribe<A>(local_1e0);
  ObserverManager::notify<FooBarProtocol>((ObserverManager *)0x11,0);
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
  ObserverManager::notify<FooBarProtocol,std::__cxx11::string_const&,char_const*>
            ((ObserverManager *)0x19,0,"Tac");
  if (local_1e0 != (A *)0x0) {
    (*(local_1e0->super_FooBarProtocol).super_BaseObserverProtocol._vptr_BaseObserverProtocol[1])();
  }
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper<false>::Compare<char[25],std::__cxx11::string>
            ((EqHelper<false> *)local_2f8,"\"Tic Tic Tac Tac Tic Tac \"","out.str()",
             (char (*) [25])"Tic Tic Tac Tac Tic Tac ",&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/fnz[P]ObserverManager/Tests/Basic.cpp"
               ,0x26,pcVar3);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&a1);
  return;
}

Assistant:

TEST(ObserverManager, Basic) {
    std::stringstream out;

    A* a1 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a1);
    
    A* a2 = new A(out, "Tic");
    ObserverManager::subscribe<FooBarProtocol>(a2);
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    EXPECT_EQ("Tic Tic Tac Tac ", out.str());
    
    // Check deletion
    delete a1;
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    EXPECT_EQ("Tic Tic Tac Tac Tic Tac ", out.str());
    
    // Check unsubscribing
    ObserverManager::unsubscribe(a2);
    
    ObserverManager::notify(&FooBarProtocol::foo);
    ObserverManager::notify(&FooBarProtocol::bar, "Tac");

    delete a2;

    EXPECT_EQ("Tic Tic Tac Tac Tic Tac ", out.str());
}